

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# znzlib.c
# Opt level: O0

size_t znzwrite(void *buf,size_t size,size_t nmemb,znzFile file)

{
  int iVar1;
  char *local_50;
  int nwritten;
  uint n2write;
  char *cbuf;
  size_t remain;
  znzFile file_local;
  size_t nmemb_local;
  size_t size_local;
  void *buf_local;
  
  cbuf = (char *)(size * nmemb);
  if (file == (znzFile)0x0) {
    buf_local = (void *)0x0;
  }
  else {
    _nwritten = buf;
    if (file->zfptr == (gzFile)0x0) {
      buf_local = (void *)fwrite(buf,size,nmemb,(FILE *)file->nzfptr);
    }
    else {
      do {
        if (cbuf == (char *)0x0) break;
        if (cbuf < (char *)0x40000000) {
          local_50 = cbuf;
        }
        else {
          local_50 = (char *)0x40000000;
        }
        iVar1 = gzwrite(file->zfptr,_nwritten,(ulong)local_50 & 0xffffffff);
        if (iVar1 < 0) {
          return (long)iVar1;
        }
        cbuf = cbuf + -(long)iVar1;
        _nwritten = (void *)((long)_nwritten + (long)iVar1);
      } while ((int)local_50 <= iVar1);
      if ((cbuf != (char *)0x0) && (cbuf < size)) {
        fprintf(_stderr,"** znzwrite: write short by %u bytes\n",(ulong)cbuf & 0xffffffff);
      }
      buf_local = (void *)(nmemb - (ulong)cbuf / size);
    }
  }
  return (size_t)buf_local;
}

Assistant:

size_t znzwrite(const void* buf, size_t size, size_t nmemb, znzFile file)
{
  size_t     remain = size*nmemb;
  const char * cbuf = (const char *)buf;
  unsigned   n2write;
  int        nwritten;

  if (file==NULL) { return 0; }
#ifdef HAVE_ZLIB
  if (file->zfptr!=NULL) {
    while( remain > 0 ) {
       n2write = (remain < ZNZ_MAX_BLOCK_SIZE) ? remain : ZNZ_MAX_BLOCK_SIZE;
       nwritten = gzwrite(file->zfptr, (const void *)cbuf, n2write);

       /* gzread returns 0 on error, but in case that ever changes... */
       if( nwritten < 0 ) return nwritten;

       remain -= nwritten;
       cbuf += nwritten;

       /* require writing n2write bytes, so we don't get stuck */
       if( nwritten < (int)n2write ) break;
    }

    /* warn of a short write that will seem complete */
    if( remain > 0 && remain < size )
      fprintf(stderr,"** znzwrite: write short by %u bytes\n",(unsigned)remain);

    return nmemb - remain/size;   /* return number of members processed */
  }
#endif
  return fwrite(buf,size,nmemb,file->nzfptr);
}